

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O0

int qstrnicmp(char *str1,char *str2,size_t len)

{
  char cVar1;
  int iVar2;
  long in_RDX;
  long in_RSI;
  char *in_RDI;
  int res;
  uchar c;
  uchar *s2;
  uchar *s1;
  int local_3c;
  char *local_28;
  long local_20;
  int local_4;
  
  if ((in_RDI == (char *)0x0) || (local_28 = in_RDI, local_20 = in_RDX, in_RSI == 0)) {
    if (in_RDI == (char *)0x0) {
      local_3c = 0;
      if (in_RSI != 0) {
        local_3c = -1;
      }
    }
    else {
      local_3c = 1;
    }
    local_4 = local_3c;
  }
  else {
    while (local_20 != 0) {
      cVar1 = *local_28;
      iVar2 = QtMiscUtils::caseCompareAscii('\0','\0');
      if (iVar2 != 0) {
        return iVar2;
      }
      if (cVar1 == '\0') break;
      local_28 = local_28 + 1;
      local_20 = local_20 + -1;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int qstrnicmp(const char *str1, const char *str2, size_t len)
{
    const uchar *s1 = reinterpret_cast<const uchar *>(str1);
    const uchar *s2 = reinterpret_cast<const uchar *>(str2);
    if (!s1 || !s2)
        return s1 ? 1 : (s2 ? -1 : 0);
    for (; len--; ++s1, ++s2) {
        const uchar c = *s1;
        if (int res = QtMiscUtils::caseCompareAscii(c, *s2))
            return res;
        if (!c)                                // strings are equal
            break;
    }
    return 0;
}